

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  Song *pSVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  ostream *poVar12;
  out_of_range *this;
  ulong *puVar13;
  Song *extraout_RDX;
  Song *extraout_RDX_00;
  Song *extraout_RDX_01;
  Song *pSVar14;
  Song *extraout_RDX_02;
  Song *extraout_RDX_03;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_t sVar19;
  size_t sVar20;
  string *psVar21;
  long lVar22;
  Song tmp;
  string artist;
  string title;
  int count;
  int n;
  Song s;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  int local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  ulong local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  string local_b8;
  string local_98;
  Song local_78;
  
  std::istream::operator>>((istream *)&std::cin,&local_bc);
  if (0 < local_bc) {
    iVar7 = 0;
    do {
      local_c4 = iVar7;
      local_f0 = &local_e0;
      local_110 = &local_100;
      local_e8 = 0;
      local_e0 = 0;
      local_108 = 0;
      local_100 = 0;
      piVar8 = std::operator>>((istream *)&std::cin,(string *)&local_f0);
      piVar8 = std::operator>>(piVar8,(string *)&local_110);
      std::istream::operator>>(piVar8,&local_c0);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_f0,local_f0 + local_e8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_110,local_110 + local_108)
      ;
      Song::Song(&local_78,&local_98,&local_b8,local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      sVar19 = pq1.mSize;
      sVar20 = pq1.mCap;
      if (pq1.mCap < pq1.mSize + 1) {
        uVar15 = pq1.mCap * 2;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar15;
        uVar9 = SUB168(auVar3 * ZEXT816(0x48),0) | 8;
        if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
          uVar9 = 0xffffffffffffffff;
        }
        puVar10 = (ulong *)operator_new__(uVar9);
        *puVar10 = uVar15;
        if (uVar15 != 0) {
          lVar11 = sVar20 * 0x90;
          puVar13 = puVar10 + 7;
          do {
            puVar13[-6] = (ulong)(puVar13 + -4);
            puVar13[-5] = 0;
            *(undefined1 *)(puVar13 + -4) = 0;
            puVar13[-2] = (ulong)puVar13;
            puVar13[-1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar13 = puVar13 + 9;
            lVar11 = lVar11 + -0x48;
          } while (lVar11 != 0);
        }
        local_d0 = uVar15;
        if (sVar19 == 0) {
          sVar19 = 0;
        }
        else {
          psVar21 = (string *)(puVar10 + 5);
          lVar11 = 0;
          uVar15 = 0;
          do {
            pSVar14 = pq1.mData;
            std::__cxx11::string::_M_assign(psVar21 + -0x20);
            std::__cxx11::string::_M_assign(psVar21);
            *(undefined4 *)(psVar21 + 0x20) = *(undefined4 *)((long)&pSVar14->count + lVar11);
            uVar15 = uVar15 + 1;
            psVar21 = psVar21 + 0x48;
            lVar11 = lVar11 + 0x48;
            sVar19 = pq1.mSize;
          } while (uVar15 < pq1.mSize);
        }
        pSVar14 = pq1.mData;
        if (pq1.mData != (Song *)0x0) {
          lVar11 = *(long *)&pq1.mData[-1].count;
          if (lVar11 != 0) {
            paVar18 = &pq1.mData[lVar11 + -1].title.field_2;
            lVar22 = lVar11 * -0x48;
            do {
              if (paVar18 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                                paVar18->_M_allocated_capacity + 1);
              }
              if (&paVar18->_M_allocated_capacity + -4 !=
                  (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
                operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                                (&paVar18->_M_allocated_capacity)[-4] + 1);
              }
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar18->_M_allocated_capacity + -9);
              lVar22 = lVar22 + 0x48;
            } while (lVar22 != 0);
          }
          operator_delete__(&pSVar14[-1].count,lVar11 * 0x48 + 8);
          sVar19 = pq1.mSize;
        }
        pq1.mData = (Song *)(puVar10 + 1);
        pq1.mCap = local_d0;
      }
      pSVar14 = pq1.mData + sVar19;
      std::__cxx11::string::_M_assign((string *)pSVar14);
      std::__cxx11::string::_M_assign((string *)&pSVar14->title);
      pSVar14->count = local_78.count;
      sVar20 = pq1.mSize;
      pSVar14 = pq1.mData + pq1.mSize;
      pq1.mSize = pq1.mSize + 1;
      Song::Song((Song *)local_158,pSVar14);
      pSVar14 = extraout_RDX;
      if (sVar20 == 0) {
        sVar20 = 0;
      }
      else {
        do {
          uVar15 = sVar20 - 1;
          uVar9 = uVar15 >> 1;
          bVar6 = CP::
                  priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                  ::anon_class_1_0_00000001_for_mLess::operator()
                            ((anon_class_1_0_00000001_for_mLess *)local_158,pq1.mData + uVar9,
                             pSVar14);
          pSVar14 = pq1.mData;
          if (bVar6) break;
          pSVar1 = pq1.mData + sVar20;
          std::__cxx11::string::_M_assign((string *)pSVar1);
          std::__cxx11::string::_M_assign((string *)&pSVar1->title);
          pSVar1->count = pSVar14[uVar9].count;
          pSVar14 = extraout_RDX_00;
          sVar20 = uVar9;
        } while (1 < uVar15);
      }
      pSVar14 = pq1.mData + sVar20;
      std::__cxx11::string::_M_assign((string *)pSVar14);
      std::__cxx11::string::_M_assign((string *)&pSVar14->title);
      pSVar14->count = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != &local_128) {
        operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      sVar19 = pq2.mSize;
      sVar20 = pq2.mCap;
      if (pq2.mCap < pq2.mSize + 1) {
        uVar15 = pq2.mCap * 2;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar15;
        uVar9 = SUB168(auVar4 * ZEXT816(0x48),0) | 8;
        if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
          uVar9 = 0xffffffffffffffff;
        }
        puVar10 = (ulong *)operator_new__(uVar9);
        *puVar10 = uVar15;
        if (uVar15 != 0) {
          lVar11 = sVar20 * 0x90;
          puVar13 = puVar10 + 7;
          do {
            puVar13[-6] = (ulong)(puVar13 + -4);
            puVar13[-5] = 0;
            *(undefined1 *)(puVar13 + -4) = 0;
            puVar13[-2] = (ulong)puVar13;
            puVar13[-1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar13 = puVar13 + 9;
            lVar11 = lVar11 + -0x48;
          } while (lVar11 != 0);
        }
        local_d0 = uVar15;
        if (sVar19 == 0) {
          sVar19 = 0;
        }
        else {
          psVar21 = (string *)(puVar10 + 5);
          lVar11 = 0;
          uVar15 = 0;
          do {
            pSVar14 = pq2.mData;
            std::__cxx11::string::_M_assign(psVar21 + -0x20);
            std::__cxx11::string::_M_assign(psVar21);
            *(undefined4 *)(psVar21 + 0x20) = *(undefined4 *)((long)&pSVar14->count + lVar11);
            uVar15 = uVar15 + 1;
            psVar21 = psVar21 + 0x48;
            lVar11 = lVar11 + 0x48;
            sVar19 = pq2.mSize;
          } while (uVar15 < pq2.mSize);
        }
        pSVar14 = pq2.mData;
        if (pq2.mData != (Song *)0x0) {
          lVar11 = *(long *)&pq2.mData[-1].count;
          if (lVar11 != 0) {
            paVar18 = &pq2.mData[lVar11 + -1].title.field_2;
            lVar22 = lVar11 * -0x48;
            do {
              if (paVar18 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                                paVar18->_M_allocated_capacity + 1);
              }
              if (&paVar18->_M_allocated_capacity + -4 !=
                  (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
                operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                                (&paVar18->_M_allocated_capacity)[-4] + 1);
              }
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar18->_M_allocated_capacity + -9);
              lVar22 = lVar22 + 0x48;
            } while (lVar22 != 0);
          }
          operator_delete__(&pSVar14[-1].count,lVar11 * 0x48 + 8);
          sVar19 = pq2.mSize;
        }
        pq2.mData = (Song *)(puVar10 + 1);
        pq2.mCap = local_d0;
      }
      pSVar14 = pq2.mData + sVar19;
      std::__cxx11::string::_M_assign((string *)pSVar14);
      std::__cxx11::string::_M_assign((string *)&pSVar14->title);
      pSVar14->count = local_78.count;
      sVar20 = pq2.mSize;
      pSVar14 = pq2.mData + pq2.mSize;
      pq2.mSize = pq2.mSize + 1;
      Song::Song((Song *)local_158,pSVar14);
      if (sVar20 == 0) {
        sVar20 = 0;
      }
      else {
        do {
          uVar15 = sVar20 - 1;
          uVar9 = uVar15 >> 1;
          if (local_118 == pq2.mData[uVar9].count) {
            if ((local_158._8_8_ == pq2.mData[uVar9].artist._M_string_length) &&
               ((local_158._8_8_ == 0 ||
                (iVar7 = bcmp((void *)local_158._0_8_,pq2.mData[uVar9].artist._M_dataplus._M_p,
                              local_158._8_8_), iVar7 == 0)))) {
              iVar7 = std::__cxx11::string::compare((string *)&local_138);
            }
            else {
              iVar7 = std::__cxx11::string::compare((string *)local_158);
            }
            if (0 < iVar7) break;
          }
          else if (local_118 < pq2.mData[uVar9].count) break;
          pSVar1 = pq2.mData;
          pSVar14 = pq2.mData + sVar20;
          std::__cxx11::string::_M_assign((string *)pSVar14);
          std::__cxx11::string::_M_assign((string *)&pSVar14->title);
          pSVar14->count = pSVar1[uVar9].count;
          sVar20 = uVar9;
        } while (1 < uVar15);
      }
      pSVar14 = pq2.mData + sVar20;
      std::__cxx11::string::_M_assign((string *)pSVar14);
      std::__cxx11::string::_M_assign((string *)&pSVar14->title);
      pSVar14->count = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != &local_128) {
        operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.title._M_dataplus._M_p != &local_78.title.field_2) {
        operator_delete(local_78.title._M_dataplus._M_p,
                        local_78.title.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.artist._M_dataplus._M_p != &local_78.artist.field_2) {
        operator_delete(local_78.artist._M_dataplus._M_p,
                        local_78.artist.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      iVar5 = local_c4;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
      }
      iVar7 = iVar5 + 1;
    } while (iVar5 + 1 < local_bc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Order By Artist-Title-count ---",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  do {
    if (pq1.mSize == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- Order By count-Artist-Title ---",0x23);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      while( true ) {
        if (pq2.mSize == 0) {
          return 0;
        }
        poVar12 = operator<<((ostream *)&std::cout,pq2.mData);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        sVar20 = pq2.mSize;
        pSVar14 = pq2.mData;
        if (pq2.mSize == 0) break;
        std::__cxx11::string::_M_assign((string *)pq2.mData);
        std::__cxx11::string::_M_assign((string *)&pSVar14->title);
        pSVar14->count = pSVar14[sVar20 - 1].count;
        pq2.mSize = pq2.mSize - 1;
        Song::Song((Song *)local_158,pq2.mData);
        if (pq2.mSize < 2) {
          uVar15 = 0;
        }
        else {
          uVar9 = 1;
          lVar11 = 0;
          uVar15 = 0;
          do {
            uVar16 = lVar11 + 2;
            uVar17 = uVar9;
            if (uVar16 < pq2.mSize) {
              if (pq2.mData[uVar9].count == pq2.mData[uVar16].count) {
                pSVar14 = pq2.mData + uVar9;
                sVar2 = (pSVar14->artist)._M_string_length;
                if ((sVar2 == pq2.mData[uVar16].artist._M_string_length) &&
                   ((sVar2 == 0 ||
                    (iVar7 = bcmp((pSVar14->artist)._M_dataplus._M_p,
                                  pq2.mData[uVar16].artist._M_dataplus._M_p,sVar2), iVar7 == 0)))) {
                  iVar7 = std::__cxx11::string::compare((string *)&pSVar14->title);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((string *)pSVar14);
                }
                bVar6 = 0 < iVar7;
              }
              else {
                bVar6 = pq2.mData[uVar9].count < pq2.mData[uVar16].count;
              }
              uVar17 = uVar16;
              if (!bVar6) {
                uVar17 = uVar9;
              }
            }
            if (pq2.mData[uVar17].count == local_118) {
              pSVar14 = pq2.mData + uVar17;
              sVar2 = (pSVar14->artist)._M_string_length;
              if ((sVar2 == local_158._8_8_) &&
                 ((sVar2 == 0 ||
                  (iVar7 = bcmp((pSVar14->artist)._M_dataplus._M_p,(void *)local_158._0_8_,sVar2),
                  iVar7 == 0)))) {
                iVar7 = std::__cxx11::string::compare((string *)&pSVar14->title);
              }
              else {
                iVar7 = std::__cxx11::string::compare((string *)pSVar14);
              }
              if (0 < iVar7) break;
            }
            else if (pq2.mData[uVar17].count < local_118) break;
            pSVar1 = pq2.mData;
            pSVar14 = pq2.mData + uVar15;
            std::__cxx11::string::_M_assign((string *)pSVar14);
            std::__cxx11::string::_M_assign((string *)&pSVar14->title);
            pSVar14->count = pSVar1[uVar17].count;
            lVar11 = uVar17 * 2;
            uVar9 = uVar17 * 2 + 1;
            uVar15 = uVar17;
          } while (uVar9 < pq2.mSize);
        }
        pSVar14 = pq2.mData + uVar15;
        std::__cxx11::string::_M_assign((string *)pSVar14);
        std::__cxx11::string::_M_assign((string *)&pSVar14->title);
        pSVar14->count = local_118;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != &local_128) {
          operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
      }
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"index of out range");
LAB_0010322c:
      __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    poVar12 = operator<<((ostream *)&std::cout,pq1.mData);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    sVar20 = pq1.mSize;
    pSVar14 = pq1.mData;
    if (pq1.mSize == 0) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"index of out range");
      goto LAB_0010322c;
    }
    std::__cxx11::string::_M_assign((string *)pq1.mData);
    std::__cxx11::string::_M_assign((string *)&pSVar14->title);
    pSVar14->count = pSVar14[sVar20 - 1].count;
    pq1.mSize = pq1.mSize - 1;
    Song::Song((Song *)local_158,pq1.mData);
    if (pq1.mSize < 2) {
      uVar15 = 0;
    }
    else {
      uVar9 = 1;
      lVar11 = 0;
      pSVar14 = extraout_RDX_01;
      uVar15 = 0;
      do {
        uVar16 = lVar11 + 2;
        uVar17 = uVar9;
        if ((uVar16 < pq1.mSize) &&
           (bVar6 = CP::
                    priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                    ::anon_class_1_0_00000001_for_mLess::operator()
                              ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar9),
                               pq1.mData + uVar16,pSVar14), pSVar14 = extraout_RDX_02,
           uVar17 = uVar16, !bVar6)) {
          uVar17 = uVar9;
        }
        bVar6 = CP::
                priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                ::anon_class_1_0_00000001_for_mLess::operator()
                          ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar17),
                           (Song *)local_158,pSVar14);
        pSVar14 = pq1.mData;
        if (bVar6) break;
        pSVar1 = pq1.mData + uVar15;
        std::__cxx11::string::_M_assign((string *)pSVar1);
        std::__cxx11::string::_M_assign((string *)&pSVar1->title);
        pSVar1->count = pSVar14[uVar17].count;
        lVar11 = uVar17 * 2;
        uVar9 = uVar17 * 2 + 1;
        pSVar14 = extraout_RDX_03;
        uVar15 = uVar17;
      } while (uVar9 < pq1.mSize);
    }
    pSVar14 = pq1.mData + uVar15;
    std::__cxx11::string::_M_assign((string *)pSVar14);
    std::__cxx11::string::_M_assign((string *)&pSVar14->title);
    pSVar14->count = local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
  } while( true );
}

Assistant:

int main() {
  int n;
  cin >> n;
  for (int i = 0;i < n;i++) {
    string title,artist;
    int count;
    cin >> title >> artist >> count;
    Song s(title,artist,count);
    pq1.push(s);
    pq2.push(s);
  }

  cout << "--- Order By Artist-Title-count ---" << endl;
  while (pq1.empty() == false) {
    cout << pq1.top() << endl;
    pq1.pop();
  }

  cout << "--- Order By count-Artist-Title ---" << endl;
  while (pq2.empty() == false) {
    cout << pq2.top() << endl;
    pq2.pop();
  }
}